

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QOffscreenBackingStore ** __thiscall
QHash<unsigned_long_long,_QOffscreenBackingStore_*>::operator[]
          (QHash<unsigned_long_long,_QOffscreenBackingStore_*> *this,unsigned_long_long *key)

{
  QOffscreenBackingStore **ppQVar1;
  long in_FS_OFFSET;
  unsigned_long_long *in_stack_ffffffffffffffb8;
  QHash<unsigned_long_long,_QOffscreenBackingStore_*> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  ppQVar1 = iterator::operator*((iterator *)0x10e7d3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return ppQVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }